

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O1

int __thiscall tcmalloc::CentralFreeList::tc_length(CentralFreeList *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  SpinLockHolder local_20;
  SpinLockHolder h;
  
  LOCK();
  bVar3 = (this->lock_).lockword_.super___atomic_base<int>._M_i == 0;
  if (bVar3) {
    (this->lock_).lockword_.super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  local_20.lock_ = &this->lock_;
  if (!bVar3) {
    SpinLock::SlowLock(&this->lock_);
  }
  iVar1 = (&DAT_0012e644)[(uint)this->size_class_];
  iVar2 = this->used_slots_;
  SpinLockHolder::~SpinLockHolder(&local_20);
  return iVar1 * iVar2;
}

Assistant:

int CentralFreeList::tc_length() {
  SpinLockHolder h(&lock_);
  return used_slots_ * Static::sizemap()->num_objects_to_move(size_class_);
}